

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRAM.c
# Opt level: O0

uint16_t sanitize_VRAM_address(uint16_t address)

{
  _Bool _Var1;
  undefined2 local_a;
  uint16_t address_local;
  
  local_a = address & 0x3fff;
  _Var1 = is_nametable_mirror(local_a);
  if (_Var1) {
    local_a = local_a - 0x1000;
  }
  _Var1 = is_pallete_mirror(local_a);
  if (_Var1) {
    local_a = local_a & 0x1f | 0x3f00;
  }
  _Var1 = is_special_pallete_mirror(local_a);
  if (_Var1) {
    local_a = local_a & 0xf | 0x3f00;
  }
  _Var1 = is_horizontal_mirror(local_a);
  if (_Var1) {
    local_a = local_a & 0xfbff;
  }
  else {
    _Var1 = is_vertical_mirror(local_a);
    if (_Var1) {
      local_a = local_a & 0xf7ff;
    }
    else if (mirroring == single_screen_low) {
      local_a = local_a & 0x3ff | 0x2000;
    }
    else if (mirroring == single_screen_high) {
      local_a = local_a & 0x3ff | 0x2400;
    }
  }
  return local_a;
}

Assistant:

static uint16_t sanitize_VRAM_address(uint16_t address) {
    address &= VRAM_WRAP_MASK;
    if(is_nametable_mirror(address)) address -= 0x1000;
    if(is_pallete_mirror(address)) address = PALLATE_TABLE_BASE_ADDR | (address & 0x1F);
    if(is_special_pallete_mirror(address)) address = PALLATE_TABLE_BASE_ADDR | (address & 0xF);

    // Four screen does not mirror
    if(is_horizontal_mirror(address)) address &= ~0x0400;
    else if(is_vertical_mirror(address)) address &= ~0x0800;
    else if(mirroring == single_screen_low) address = NAMETABLE1_BASE_ADDR | (address & 0x03FF);
    else if(mirroring == single_screen_high) address = NAMETABLE2_BASE_ADDR | (address & 0x03FF);
    return address;
}